

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void cast_string_realloc(uint16_t needed,char **str,uint16_t *used,uint16_t *size)

{
  ushort uVar1;
  char *pcVar2;
  LY_ERR *pLVar3;
  int iVar4;
  undefined6 in_register_0000003a;
  
  uVar1 = *size;
  iVar4 = (int)CONCAT62(in_register_0000003a,needed);
  if ((int)((uint)uVar1 - (uint)*used) < iVar4) {
    do {
      uVar1 = uVar1 + 0x10;
      *size = uVar1;
    } while ((int)((uint)uVar1 - (uint)*used) < iVar4);
    pcVar2 = (char *)ly_realloc(*str,(ulong)(uint)uVar1);
    *str = pcVar2;
    if (pcVar2 == (char *)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","cast_string_realloc");
      return;
    }
  }
  return;
}

Assistant:

static void
cast_string_realloc(uint16_t needed, char **str, uint16_t *used, uint16_t *size)
{
    if (*size - *used < needed) {
        do {
            *size += LYXP_STRING_CAST_SIZE_STEP;
        } while (*size - *used < needed);
        *str = ly_realloc(*str, *size * sizeof(char));
        if (!(*str)) {
            LOGMEM;
        }
    }
}